

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.h
# Opt level: O3

void __thiscall SInputFile::SInputFile(SInputFile *this,int param_1)

{
  std::filesystem::__cxx11::path::path(&this->full);
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->str,"<stdin>","");
  return;
}

Assistant:

SInputFile(int) : full(), str("<stdin>") {}